

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O1

void __thiscall
pg::PSISolver::compute_val(PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int v)

{
  void *__dest;
  int *piVar1;
  int iVar2;
  Worker *pWVar3;
  uint uVar4;
  ulong uVar5;
  TD_compute_val *t;
  Task *__dq_head;
  int iVar6;
  int iVar7;
  long lVar8;
  
  lVar8 = (long)v;
  *(undefined4 *)(done + lVar8 * 4) = 1;
  iVar6 = *(int *)(str + lVar8 * 4);
  __dest = (void *)(val + (long)(int)(v * k) * 4);
  if (((long)iVar6 == -1) || (*(int *)(halt + (long)iVar6 * 4) != 0)) {
    memset(__dest,0,(ulong)k << 2);
  }
  else {
    memcpy(__dest,(void *)(val + (long)(int)(iVar6 * k) * 4),(ulong)k << 2);
  }
  piVar1 = (int *)((long)__dest + (long)((this->super_Solver).game)->_priority[lVar8] * 4);
  *piVar1 = *piVar1 + 1;
  iVar6 = *(int *)(first_in + lVar8 * 4);
  iVar7 = 0;
  do {
    if (iVar6 == -1) break;
    iVar2 = *(int *)(next_in + (long)iVar6 * 4);
    if (iVar2 == -1) {
      compute_val(this,__lace_worker,__lace_dq_head,iVar6);
    }
    else {
      if (__lace_worker->end == __lace_dq_head) {
        lace_abort_stack_overflow();
      }
      __lace_dq_head->f = compute_val_WRAP;
      (__lace_dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
      *(int *)__lace_dq_head->d = iVar6;
      *(PSISolver **)(__lace_dq_head->d + 8) = this;
      pWVar3 = __lace_worker->_public;
      if (__lace_worker->allstolen == '\0') {
        if (pWVar3->movesplit != '\0') {
          uVar4 = (uint)((int)((ulong)((long)__lace_dq_head - (long)__lace_worker->dq) >> 6) + 2 +
                        (int)((ulong)((long)__lace_worker->split - (long)__lace_worker->dq) >> 6))
                  >> 1;
          LOCK();
          *(uint *)((long)&pWVar3->ts + 4) = uVar4;
          UNLOCK();
          __lace_worker->split = __lace_worker->dq + uVar4;
          pWVar3->movesplit = '\0';
        }
      }
      else {
        if (pWVar3->movesplit != '\0') {
          pWVar3->movesplit = '\0';
        }
        uVar5 = (long)__lace_dq_head - (long)__lace_worker->dq;
        LOCK();
        pWVar3->ts = (TailSplit)
                     ((uVar5 >> 6 & 0xffffffff | (uVar5 & 0xffffffffffffffc0) << 0x1a) + 0x100000000
                     );
        UNLOCK();
        pWVar3->allstolen = '\0';
        __lace_worker->split = __lace_dq_head + 1;
        __lace_worker->allstolen = '\0';
      }
      __lace_dq_head = __lace_dq_head + 1;
      iVar7 = iVar7 + 1;
      iVar6 = iVar2;
    }
  } while (iVar2 != -1);
  for (; iVar7 != 0; iVar7 = iVar7 + -1) {
    __dq_head = __lace_dq_head + -1;
    if ((__lace_worker->_public->movesplit == '\0') && (__lace_worker->split <= __dq_head)) {
      __lace_dq_head[-1].thief._M_b._M_p = (__pointer_type)0x0;
      compute_val(*(PSISolver **)(__lace_dq_head[-1].d + 8),__lace_worker,__dq_head,
                  *(int *)__lace_dq_head[-1].d);
    }
    else {
      compute_val_SYNC_SLOW(__lace_worker,__dq_head);
    }
    __lace_dq_head = __dq_head;
  }
  return;
}

Assistant:

void
PSISolver::compute_val(WorkerP* __lace_worker, Task* __lace_dq_head, int v)
{
    // mark node as visited
    done[v] = 1;

    // compute valuation of current node
    int st = str[v];
    int *dst = val + k*v;
    if (st == -1 or halt[st]) memset(dst, 0, sizeof(int[k]));
    else memcpy(dst, val + k*st, sizeof(int[k])); // copy from successor
    dst[priority(v)]++;

    // recursively update predecessor positions
    int count = 0;
    int from = first_in[v];
    while (from != -1) {
        int next = next_in[from];
        if (next != -1) {
            SPAWN(compute_val, from, this);
            count++;
        } else {
            CALL(compute_val, from, this);
            break;
        }
        from = next;
    }

    while (count--) {
        SYNC(compute_val);
    }
}